

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_6,_6>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  undefined8 in_RAX;
  undefined8 *puVar2;
  float *pfVar3;
  long lVar4;
  undefined4 *puVar5;
  float *pfVar6;
  long lVar7;
  int col_1;
  long lVar8;
  undefined8 *puVar9;
  int col;
  undefined4 uVar10;
  float afStack_90 [4];
  Vector<float,_3> res;
  Type in1;
  undefined8 uStack_58;
  Type in0;
  float afStack_38 [2];
  Matrix<float,_3,_2> retVal;
  Vec4 *local_18;
  int local_10 [2];
  undefined8 local_8;
  
  puVar2 = &uStack_58;
  local_8 = in_RAX;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    lVar7 = 0;
    do {
      lVar8 = 0;
      do {
        uVar10 = 0x3f800000;
        if (lVar4 != lVar8) {
          uVar10 = 0;
        }
        *(undefined4 *)((long)puVar2 + lVar8) = uVar10;
        lVar8 = lVar8 + 0xc;
      } while (lVar8 == 0xc);
      lVar7 = lVar7 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      lVar4 = lVar4 + 0xc;
    } while (lVar7 != 3);
    uStack_58 = *(undefined8 *)evalCtx->in[0].m_data;
    in0.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    in0.m_data.m_data[0].m_data[1] = (float)uVar1;
    in0.m_data.m_data[0].m_data[2] = (float)((ulong)uVar1 >> 0x20);
    in0.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[2];
  }
  else {
    uStack_58 = 0;
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[0].m_data[2] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    puVar5 = &sr::(anonymous_namespace)::s_constInMat2x3;
    lVar4 = 0;
    do {
      lVar7 = 0;
      puVar9 = puVar2;
      do {
        *(undefined4 *)puVar9 = puVar5[lVar7];
        lVar7 = lVar7 + 1;
        puVar9 = (undefined8 *)((long)puVar9 + 0xc);
      } while (lVar7 == 1);
      lVar4 = lVar4 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      puVar5 = puVar5 + 2;
    } while (lVar4 != 3);
  }
  pfVar3 = res.m_data + 2;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    lVar7 = 0;
    do {
      lVar8 = 0;
      do {
        uVar10 = 0x3f800000;
        if (lVar4 != lVar8) {
          uVar10 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar8) = uVar10;
        lVar8 = lVar8 + 0xc;
      } while (lVar8 == 0xc);
      lVar7 = lVar7 + 1;
      pfVar3 = pfVar3 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar7 != 3);
    stack0xffffffffffffff88 = *(undefined8 *)evalCtx->in[0].m_data;
  }
  else {
    stack0xffffffffffffff88 = 0;
    puVar5 = &DAT_00b1d3d8;
    lVar4 = 0;
    do {
      lVar7 = 0;
      pfVar6 = pfVar3;
      do {
        *pfVar6 = (float)puVar5[lVar7];
        lVar7 = lVar7 + 1;
        pfVar6 = pfVar6 + 3;
      } while (lVar7 == 1);
      lVar4 = lVar4 + 1;
      pfVar3 = pfVar3 + 1;
      puVar5 = puVar5 + 2;
    } while (lVar4 != 3);
  }
  pfVar3 = afStack_38;
  afStack_38[0] = 0.0;
  afStack_38[1] = 0.0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  retVal.m_data.m_data[0].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  lVar4 = 0;
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      uVar10 = 0x3f800000;
      if (lVar4 != lVar8) {
        uVar10 = 0;
      }
      *(undefined4 *)((long)pfVar3 + lVar8) = uVar10;
      lVar8 = lVar8 + 0xc;
    } while (lVar8 == 0xc);
    lVar7 = lVar7 + 1;
    pfVar3 = pfVar3 + 1;
    lVar4 = lVar4 + 0xc;
  } while (lVar7 != 3);
  pfVar3 = afStack_38;
  pfVar6 = res.m_data + 2;
  puVar2 = &uStack_58;
  lVar4 = 0;
  do {
    lVar7 = 0;
    do {
      *(float *)((long)pfVar3 + lVar7) =
           *(float *)((long)puVar2 + lVar7) * *(float *)((long)pfVar6 + lVar7);
      lVar7 = lVar7 + 0xc;
    } while (lVar7 == 0xc);
    lVar4 = lVar4 + 1;
    pfVar3 = pfVar3 + 1;
    pfVar6 = pfVar6 + 1;
    puVar2 = (undefined8 *)((long)puVar2 + 4);
  } while (lVar4 != 3);
  res.m_data[0] = 0.0;
  afStack_90[2] = 0.0;
  afStack_90[3] = 0.0;
  lVar4 = 0;
  do {
    res.m_data[lVar4 + -2] =
         retVal.m_data.m_data[0].m_data[lVar4 + -2] + retVal.m_data.m_data[0].m_data[lVar4 + 1];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_18 = &evalCtx->color;
  local_10[0] = 0;
  local_10[1] = 1;
  local_8 = CONCAT44(local_8._4_4_,2);
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_18 + lVar4 * 4)] = afStack_90[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}